

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-write.c
# Opt level: O0

int mp3_fill_hdr(mp3_frame_t *frame)

{
  undefined1 local_20 [8];
  bv_t bv;
  mp3_frame_t *frame_local;
  
  bv._8_8_ = frame;
  if (frame != (mp3_frame_t *)0x0) {
    bv_init((bv_t *)local_20,frame->raw,0x20);
    bv_put_bits((bv_t *)local_20,0xfff,0xc);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)bv._8_8_,1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 1),2);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 2),1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 3),4);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 4),2);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 5),1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 6),1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 7),2);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 8),2);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 9),1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 10),1);
    bv_put_bits((bv_t *)local_20,(ulong)*(byte *)(bv._8_8_ + 0xb),2);
    if (*(char *)(bv._8_8_ + 2) == '\0') {
      *(undefined1 *)(bv._8_8_ + 0x4ec4) = *(undefined1 *)(bv._8_8_ + 0xc);
      *(undefined1 *)(bv._8_8_ + 0x4ec5) = *(undefined1 *)(bv._8_8_ + 0xd);
    }
    mp3_calc_hdr((mp3_frame_t *)bv._8_8_);
    return 1;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-write.c",0x68,
                "int mp3_fill_hdr(mp3_frame_t *)");
}

Assistant:

int mp3_fill_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);
  
  bv_t bv;
  bv_init(&bv, frame->raw, 4 * 8);

  bv_put_bits(&bv, 0xFFF, 12);
  bv_put_bits(&bv, frame->id, 1);
  bv_put_bits(&bv, frame->layer, 2);
  bv_put_bits(&bv, frame->protected, 1);
  bv_put_bits(&bv, frame->bitrate_index, 4);
  bv_put_bits(&bv, frame->samplerfindex, 2);
  bv_put_bits(&bv, frame->padding_bit, 1);
  bv_put_bits(&bv, frame->private_bit, 1);
  bv_put_bits(&bv, frame->mode, 2);
  bv_put_bits(&bv, frame->mode_ext, 2);
  bv_put_bits(&bv, frame->copyright, 1);
  bv_put_bits(&bv, frame->original, 1);
  bv_put_bits(&bv, frame->emphasis, 2);
  if (frame->protected == 0) {
    frame->raw[4] = frame->crc[0];
    frame->raw[5] = frame->crc[1];
  }

  assert((bv.idx == bv.len) || "Bitvector is not filled completely");
  
  mp3_calc_hdr(frame);

  return 1;
}